

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2DCFilter::renderMono(V2DCFilter *this,float *dest,float *src,int nsamples)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = this->inst->SRfcdcfilter;
  fVar5 = (this->fl).xm1;
  fVar4 = (this->fl).ym1;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    fVar4 = (fVar4 * fVar1 + 3.8146973e-06) - fVar5;
    fVar5 = src[uVar2];
    fVar4 = fVar4 + fVar5 + -3.8146973e-06;
    dest[uVar2] = fVar4;
  }
  (this->fl).xm1 = fVar5;
  (this->fl).ym1 = fVar4;
  return;
}

Assistant:

void renderMono(float *dest, const float *src, int nsamples)
    {
        float R = inst->SRfcdcfilter;

        V2DCF l = fl;
        for (int i=0; i < nsamples; i++)
            dest[i] = l.step(src[i], R);
        fl = l;
    }